

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(uint lhs,
         SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *this;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_RSI;
  uint in_EDI;
  uint ret;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  uint *in_stack_ffffffffffffffb8;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffc0;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_20;
  undefined4 in_stack_ffffffffffffffe8;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff8;
  
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_20);
  bVar1 = DivisionCornerCaseHelper<long,_unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
          ::DivisionCornerCase1
                    ((uint)((ulong)in_RSI.m_int >> 0x20),in_stack_fffffffffffffff8,
                     (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
  if ((!bVar1) &&
     (bVar1 = DivisionCornerCaseHelper2<long,_unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
              ::DivisionCornerCase2(in_EDI,in_RSI,&local_20), !bVar1)) {
    this = (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *)
           SafeInt::operator_cast_to_long(in_stack_ffffffffffffffc0);
    DivisionHelper<unsigned_int,long,1>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              ((uint *)this,(long *)in_stack_ffffffffffffffb8,(uint *)0x209850);
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<unsigned_int>(this,in_stack_ffffffffffffffb8);
    local_20.m_int = in_stack_fffffffffffffff8.m_int;
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_20.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}